

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clause.cpp
# Opt level: O0

bool __thiscall Clasp::mt::SharedLitsClause::simplify(SharedLitsClause *this,Solver *s,bool reinit)

{
  bool bVar1;
  int iVar2;
  Literal *pLVar3;
  ClauseHead *pCVar4;
  Literal *pLVar5;
  byte in_DL;
  undefined8 in_RSI;
  Literal *in_RDI;
  Literal *e_1;
  Literal *r_1;
  ClauseHead *h;
  InfoType myInfo;
  Literal *e;
  Literal *r;
  Literal *j;
  Literal lits [5];
  uint32 optSize;
  SharedLiterals *in_stack_ffffffffffffff50;
  ClauseRep *rep;
  Solver *in_stack_ffffffffffffff58;
  Solver *s_00;
  ClauseHead *in_stack_ffffffffffffff60;
  ClauseRep *this_00;
  undefined4 in_stack_ffffffffffffff70;
  uint32 uVar6;
  Literal *local_80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  SharedLiterals *in_stack_ffffffffffffff90;
  Literal *local_48;
  ClauseRep *local_40;
  ClauseRep local_38;
  undefined1 auStack_24 [35];
  bool local_1;
  
  auStack_24[0xb] = in_DL & 1;
  auStack_24._12_8_ = in_RSI;
  bVar1 = ClauseHead::satisfied(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  if (bVar1) {
    (**(code **)(*(long *)in_RDI + 0x90))(in_RDI,auStack_24._12_8_);
    local_1 = true;
  }
  else {
    auStack_24._4_4_ =
         SharedLiterals::simplify
                   (in_stack_ffffffffffffff90,
                    (Solver *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (auStack_24._4_4_ == 0) {
      (**(code **)(*(long *)in_RDI + 0x90))(in_RDI,auStack_24._12_8_);
      local_1 = true;
    }
    else if ((uint)auStack_24._4_4_ < 6) {
      s_00 = (Solver *)auStack_24;
      this_00 = &local_38;
      do {
        rep = this_00;
        Literal::Literal((Literal *)rep);
        this_00 = (ClauseRep *)&rep->field_0x4;
      } while ((Solver *)this_00 != s_00);
      local_40 = &local_38;
      local_48 = SharedLiterals::begin(*(SharedLiterals **)(in_RDI + 2));
      pLVar3 = SharedLiterals::end((SharedLiterals *)rep);
      for (; local_48 != pLVar3; local_48 = local_48 + 1) {
        bVar1 = Solver::isFalse(s_00,(Literal)(uint32)((ulong)this_00 >> 0x20));
        if (!bVar1) {
          (local_40->info).super_ConstraintScore.rep = local_48->rep_;
          local_40 = (ClauseRep *)&local_40->field_0x4;
        }
      }
      (**(code **)(*(long *)in_RDI + 0x90))(in_RDI,auStack_24._12_8_);
      destroy((SharedLitsClause *)this_00,s_00,SUB81((ulong)rep >> 0x38,0));
      ClauseRep::prepared((Literal *)rep,SUB84(auStack_24._12_8_,4),(Info *)0x22ef3c);
      pCVar4 = Clause::newClause(this_00,s_00,rep);
      iVar2 = (*(pCVar4->super_Constraint)._vptr_Constraint[4])
                        (pCVar4,auStack_24._12_8_,(ulong)auStack_24[0xb] & 1);
      local_1 = (bool)((byte)iVar2 & 1);
    }
    else {
      bVar1 = Solver::isFalse(in_stack_ffffffffffffff58,
                              (Literal)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
      if (bVar1) {
        local_80 = SharedLiterals::begin(*(SharedLiterals **)(in_RDI + 2));
        pLVar3 = SharedLiterals::end(in_stack_ffffffffffffff50);
        for (; local_80 != pLVar3; local_80 = local_80 + 1) {
          uVar6 = local_80->rep_;
          bVar1 = Solver::isFalse(in_stack_ffffffffffffff58,
                                  (Literal)(uint32)((ulong)in_stack_ffffffffffffff60 >> 0x20));
          if ((!bVar1) &&
             (pLVar5 = std::find<Clasp::Literal*,Clasp::Literal>
                                 ((Literal *)CONCAT44(uVar6,in_stack_ffffffffffffff70),in_RDI,
                                  (Literal *)in_stack_ffffffffffffff60), pLVar5 == in_RDI + 7)) {
            in_RDI[7].rep_ = local_80->rep_;
            break;
          }
        }
      }
      local_1 = false;
    }
  }
  return local_1;
}

Assistant:

bool SharedLitsClause::simplify(Solver& s, bool reinit) {
	if (ClauseHead::satisfied(s)) {
		detach(s);
		return true;
	}
	uint32 optSize = shared_->simplify(s);
	if (optSize == 0) {
		detach(s);
		return true;
	}
	else if (optSize <= Clause::MAX_SHORT_LEN) {
		Literal lits[Clause::MAX_SHORT_LEN];
		Literal* j = lits;
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r)) *j++ = *r;
		}
		// safe extra data
		InfoType myInfo = info_;
		// detach & destroy but do not release memory
		detach(s);
		SharedLitsClause::destroy(0, false);
		// construct short clause in "this"
		ClauseHead* h = Clause::newClause(this, s, ClauseRep::prepared(lits, static_cast<uint32>(j-lits), myInfo));
		return h->simplify(s, reinit);
	}
	else if (s.isFalse(head_[2])) {
		// try to replace cache lit with non-false literal
		for (const Literal* r = shared_->begin(), *e = shared_->end(); r != e; ++r) {
			if (!s.isFalse(*r) && std::find(head_, head_+2, *r) == head_+2) {
				head_[2] = *r;
				break;
			}
		}
	}
	return false;
}